

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O3

uint32_t elf_lzma_len(uchar *compressed,size_t compressed_size,uint16_t *probs,int is_rep,
                     uint pos_state,size_t *poffset,uint32_t *prange,uint32_t *pcode)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  int iVar7;
  int local_34;
  ulong uVar6;
  
  lVar4 = 0xa68;
  if (is_rep == 0) {
    lVar4 = 0x664;
  }
  iVar1 = elf_lzma_bit(compressed,compressed_size,(uint16_t *)(lVar4 + (long)probs),poffset,prange,
                       pcode);
  if (iVar1 == 0) {
    uVar5 = pos_state * 8 + 0x536;
    if (is_rep == 0) {
      uVar5 = pos_state * 8 + 0x334;
    }
    local_34 = 2;
  }
  else {
    lVar4 = 0xa6a;
    if (is_rep == 0) {
      lVar4 = 0x666;
    }
    iVar1 = elf_lzma_bit(compressed,compressed_size,(uint16_t *)(lVar4 + (long)probs),poffset,prange
                         ,pcode);
    if (iVar1 != 0) {
      uVar3 = 0x636;
      if (is_rep == 0) {
        uVar3 = 0x434;
      }
      local_34 = 0x12;
      iVar1 = 8;
      goto LAB_001130c3;
    }
    uVar5 = pos_state * 8 + 0x5b6;
    if (is_rep == 0) {
      uVar5 = pos_state * 8 + 0x3b4;
    }
    local_34 = 10;
  }
  uVar3 = (ulong)uVar5;
  iVar1 = 3;
LAB_001130c3:
  uVar6 = 1;
  iVar7 = iVar1;
  do {
    iVar2 = elf_lzma_bit(compressed,compressed_size,probs + uVar3 + uVar6,poffset,prange,pcode);
    uVar5 = iVar2 + (int)uVar6 * 2;
    uVar6 = (ulong)uVar5;
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  return local_34 + (-1 << (sbyte)iVar1) + uVar5;
}

Assistant:

static uint32_t
elf_lzma_len (const unsigned char *compressed, size_t compressed_size,
	      uint16_t *probs, int is_rep, unsigned int pos_state,
	      size_t *poffset, uint32_t *prange, uint32_t *pcode)
{
  uint16_t *probs_choice;
  uint16_t *probs_sym;
  uint32_t bits;
  uint32_t len;

  probs_choice = probs + (is_rep
			  ? LZMA_REP_LEN_CHOICE
			  : LZMA_MATCH_LEN_CHOICE);
  if (elf_lzma_bit (compressed, compressed_size, probs_choice, poffset,
		    prange, pcode))
    {
      probs_choice = probs + (is_rep
			      ? LZMA_REP_LEN_CHOICE2
			      : LZMA_MATCH_LEN_CHOICE2);
      if (elf_lzma_bit (compressed, compressed_size, probs_choice,
			poffset, prange, pcode))
	{
	  probs_sym = probs + (is_rep
			       ? LZMA_REP_LEN_HIGH (0)
			       : LZMA_MATCH_LEN_HIGH (0));
	  bits = 8;
	  len = 2 + 8 + 8;
	}
      else
	{
	  probs_sym = probs + (is_rep
			       ? LZMA_REP_LEN_MID (pos_state, 0)
			       : LZMA_MATCH_LEN_MID (pos_state, 0));
	  bits = 3;
	  len = 2 + 8;
	}
    }
  else
    {
      probs_sym = probs + (is_rep
			   ? LZMA_REP_LEN_LOW (pos_state, 0)
			   : LZMA_MATCH_LEN_LOW (pos_state, 0));
      bits = 3;
      len = 2;
    }

  len += elf_lzma_integer (compressed, compressed_size, probs_sym, bits,
			   poffset, prange, pcode);
  return len;
}